

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

Vec_Ptr_t * Abc_NodeGetSuper(Abc_Obj_t *pNode)

{
  void **__base;
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *Entry;
  size_t sVar2;
  size_t __nmemb;
  int iVar3;
  void *pvVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  
  if ((((ulong)pNode & 1) == 0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
    p = Vec_PtrAlloc(100);
    pVVar1 = Vec_PtrAlloc(100);
    Vec_PtrPush(pVVar1,pNode);
    for (iVar3 = 0; iVar3 < pVVar1->nSize; iVar3 = iVar3 + 1) {
      pObj = (Abc_Obj_t *)Vec_PtrEntry(pVVar1,iVar3);
      Entry = Abc_ObjChild0(pObj);
      pVVar6 = p;
      if ((((ulong)Entry & 1) == 0 && (*(uint *)&Entry->field_0x14 & 0xf) == 7) &&
         ((Entry->vFanouts).nSize == 1)) {
        pVVar6 = pVVar1;
      }
      Vec_PtrPush(pVVar6,Entry);
      pvVar4 = (void *)((ulong)(*(uint *)&pObj->field_0x14 >> 0xb & 1) ^
                       (ulong)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]]);
      if ((((ulong)pvVar4 & 1) != 0 || (*(uint *)((long)pvVar4 + 0x14) & 0xf) != 7) ||
         (pVVar6 = pVVar1, *(int *)((long)pvVar4 + 0x2c) != 1)) {
        pVVar6 = p;
      }
      Vec_PtrPush(pVVar6,pvVar4);
    }
    Vec_PtrFree(pVVar1);
    iVar3 = p->nSize;
    pVVar1 = Vec_PtrAlloc(iVar3);
    while (0 < iVar3) {
      iVar3 = iVar3 + -1;
      pvVar4 = Vec_PtrEntry(p,iVar3);
      Vec_PtrPush(pVVar1,pvVar4);
    }
    Vec_PtrFree(p);
    __nmemb = (size_t)pVVar1->nSize;
    if (1 < (long)__nmemb) {
      __base = pVVar1->pArray;
      qsort(__base,__nmemb,8,Vec_CompareNodeIds);
      iVar3 = 1;
      for (sVar2 = 1; __nmemb != sVar2; sVar2 = sVar2 + 1) {
        if (__base[sVar2] != __base[sVar2 - 1]) {
          lVar5 = (long)iVar3;
          iVar3 = iVar3 + 1;
          __base[lVar5] = __base[sVar2];
        }
      }
      pVVar1->nSize = iVar3;
    }
    return pVVar1;
  }
  __assert_fail("Abc_ObjIsNode(pNode) && !Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                ,0x26a,"Vec_Ptr_t *Abc_NodeGetSuper(Abc_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NodeGetSuper( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vSuper, * vFront;
    Abc_Obj_t * pAnd, * pFanin;
    int i;
    assert( Abc_ObjIsNode(pNode) && !Abc_ObjIsComplement(pNode) );
    vSuper = Vec_PtrAlloc( 100 ); 
    // explore the frontier
    vFront = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vFront, pNode );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pAnd, i )
    {
        pFanin = Abc_ObjChild0(pAnd);
        if ( Abc_ObjIsNode(pFanin) && !Abc_ObjIsComplement(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            Vec_PtrPush( vFront, pFanin );
        else
            Vec_PtrPush( vSuper, pFanin );

        pFanin = Abc_ObjChild1(pAnd);
        if ( Abc_ObjIsNode(pFanin) && !Abc_ObjIsComplement(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            Vec_PtrPush( vFront, pFanin );
        else
            Vec_PtrPush( vSuper, pFanin );
    }
    Vec_PtrFree( vFront );
    // reverse the array of pointers to start with lower IDs
    vFront = Vec_PtrAlloc( Vec_PtrSize(vSuper) );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vSuper, pNode, i )
        Vec_PtrPush( vFront, pNode );
    Vec_PtrFree( vSuper );
    vSuper = vFront;
    // uniquify and return the frontier
    Vec_PtrUniqify( vSuper, (int (*)())Vec_CompareNodeIds );
    return vSuper;
}